

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void andres::marray_detail::
     operate<andres::marray_detail::DividedByEqual<short,int>,short,int,false,std::allocator<unsigned_long>>
               (View<short,_false,_std::allocator<unsigned_long>_> *v,
               View<int,_false,_std::allocator<unsigned_long>_> *w)

{
  CoordinateOrder CVar1;
  reference piVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  runtime_error *this;
  reference piVar6;
  reference piVar7;
  reference psVar8;
  reference piVar9;
  short *psVar10;
  int *piVar11;
  reference psVar12;
  reference piVar13;
  void *dataPointer_;
  void *vDataPointer_;
  ulong uVar14;
  Marray<int,_std::allocator<unsigned_long>_> m;
  const_iterator itW;
  Iterator<short,_false,_std::allocator<unsigned_long>_> local_a8;
  long local_78;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_60;
  
  if (((v->geometry_).size_ == 0) || ((w->geometry_).size_ == 0)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
LAB_002251e4:
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (w->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
    goto LAB_002251e4;
  }
  sVar4 = (w->geometry_).dimension_;
  if (sVar4 != 0) {
    if (v->data_ == (pointer)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_002251e4;
    }
    if ((v->geometry_).dimension_ != sVar4) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_002251e4;
    }
    if (sVar4 != 0) {
      if (v->data_ != (pointer)0x0) {
        uVar14 = 0;
        do {
          if ((v->geometry_).dimension_ <= uVar14) goto LAB_00224944;
          sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,uVar14);
          sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::shape(w,uVar14);
          if (sVar4 != sVar5) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"Assertion failed.");
            goto LAB_002251e4;
          }
          uVar14 = uVar14 + 1;
        } while (v->data_ != (pointer)0x0);
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_002251e4;
    }
  }
LAB_00224944:
  if (w->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
    goto LAB_002251e4;
  }
  if ((w->geometry_).dimension_ == 0) {
    local_a8.view_._0_4_ = 0;
    piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    local_60.view_._0_4_ = *piVar9;
    View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
    if ((v->geometry_).isSimple_ == true) {
      local_a8.view_._0_4_ = 0;
      psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      sVar4 = (v->geometry_).size_;
      if (sVar4 == 0) {
        return;
      }
      sVar5 = 0;
      do {
        psVar8[sVar5] = (short)((int)psVar8[sVar5] / (int)local_60.view_);
        sVar5 = sVar5 + 1;
      } while (sVar4 != sVar5);
      return;
    }
    if (v->data_ == (pointer)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_002251e4;
    }
    switch((v->geometry_).dimension_) {
    case 1:
      local_a8.view_._0_4_ = 0;
      psVar10 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                          (v,(int *)&local_a8);
      sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      if (sVar4 != 0) {
        uVar14 = 0;
        do {
          *psVar10 = (short)((int)*psVar10 / (int)local_60.view_);
          sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::strides(v,0);
          psVar10 = psVar10 + sVar4;
          uVar14 = uVar14 + 1;
          sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,0);
        } while (uVar14 < sVar4);
      }
      View<short,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      sVar4 = 0;
      break;
    case 2:
      local_a8.view_._0_4_ = 0;
      psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_60,psVar8);
      return;
    case 3:
      local_a8.view_._0_4_ = 0;
      psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,2);
      if (sVar4 != 0) {
        uVar14 = 0;
        do {
          OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
          ::operate(v,&local_60,psVar8);
          sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::strides(v,2);
          psVar8 = psVar8 + sVar4;
          uVar14 = uVar14 + 1;
          sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,2);
        } while (uVar14 < sVar4);
      }
      View<short,_false,_std::allocator<unsigned_long>_>::shape(v,2);
      sVar4 = 2;
      break;
    case 4:
      local_a8.view_._0_4_ = 0;
      psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_60,psVar8);
      return;
    default:
      sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 5) {
        local_a8.view_._0_4_ = 0;
        psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,psVar8);
        return;
      }
      sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 6) {
        local_a8.view_._0_4_ = 0;
        psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,psVar8);
        return;
      }
      sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 7) {
        local_a8.view_._0_4_ = 0;
        psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,psVar8);
        return;
      }
      sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 8) {
        local_a8.view_._0_4_ = 0;
        psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,psVar8);
        return;
      }
      sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 9) {
        local_a8.view_._0_4_ = 0;
        psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,psVar8);
        return;
      }
      sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 10) {
        local_a8.view_._0_4_ = 0;
        psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
        ::operate(v,&local_60,psVar8);
        return;
      }
      View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
      Iterator<short,_false,_std::allocator<unsigned_long>_>::Iterator(&local_a8,v,0);
      while (bVar3 = Iterator<short,_false,_std::allocator<unsigned_long>_>::hasMore(&local_a8),
            bVar3) {
        psVar12 = Iterator<short,_false,_std::allocator<unsigned_long>_>::operator*(&local_a8);
        *psVar12 = (short)((int)*psVar12 / (int)local_60.view_);
        Iterator<short,_false,_std::allocator<unsigned_long>_>::operator++(&local_a8);
      }
      goto LAB_0022512f;
    }
    View<short,_false,_std::allocator<unsigned_long>_>::strides(v,sVar4);
    return;
  }
  View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(w);
  piVar9 = (reference)v->data_;
  if ((piVar9 != (reference)0x0) && (piVar2 = w->data_, piVar2 != (reference)0x0)) {
    piVar6 = (reference)
             View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       (v,(v->geometry_).size_ - 1);
    piVar7 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       (w,(w->geometry_).size_ - 1);
    if (((piVar9 <= piVar2) && (piVar2 <= piVar6)) || ((piVar2 <= piVar9 && (piVar9 <= piVar7)))) {
      Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_a8,w);
      operate<andres::marray_detail::DividedByEqual<short,int>,short,int,false,std::allocator<unsigned_long>>
                (v,&local_a8);
      operator_delete((void *)CONCAT44(local_a8.view_._4_4_,local_a8.view_._0_4_),local_78 << 2);
      uVar14 = (long)local_a8.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage * 0x18;
      goto LAB_002249ef;
    }
  }
  View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  CVar1 = (v->geometry_).coordinateOrder_;
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(w);
  if ((CVar1 == (w->geometry_).coordinateOrder_) &&
     ((View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(v),
      (v->geometry_).isSimple_ == true &&
      (View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(w),
      (w->geometry_).isSimple_ == true)))) {
    local_a8.view_._0_4_ = 0;
    psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    sVar4 = (v->geometry_).size_;
    if (sVar4 == 0) {
      return;
    }
    sVar5 = 0;
    do {
      psVar8[sVar5] = (short)((int)psVar8[sVar5] / piVar9[sVar5]);
      sVar5 = sVar5 + 1;
    } while (sVar4 != sVar5);
    return;
  }
  if (v->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
    goto LAB_002251e4;
  }
  switch((v->geometry_).dimension_) {
  case 1:
    local_a8.view_._0_4_ = 0;
    psVar10 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                        (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar11 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                        (w,(int *)&local_a8);
    sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,0);
    if (sVar4 != 0) {
      uVar14 = 0;
      do {
        *psVar10 = (short)((int)*psVar10 / *piVar11);
        sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::strides(v,0);
        psVar10 = psVar10 + sVar4;
        sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::strides(w,0);
        piVar11 = piVar11 + sVar4;
        uVar14 = uVar14 + 1;
        sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      } while (uVar14 < sVar4);
    }
    View<short,_false,_std::allocator<unsigned_long>_>::shape(v,0);
    View<short,_false,_std::allocator<unsigned_long>_>::strides(v,0);
    View<int,_false,_std::allocator<unsigned_long>_>::shape(w,0);
    View<int,_false,_std::allocator<unsigned_long>_>::strides(w,0);
    return;
  case 2:
    local_a8.view_._0_4_ = 0;
    psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,psVar8,piVar9);
    return;
  case 3:
    local_a8.view_._0_4_ = 0;
    psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,psVar8,piVar9);
    return;
  case 4:
    local_a8.view_._0_4_ = 0;
    psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,psVar8,piVar9);
    return;
  }
  sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar4 == 5) {
    local_a8.view_._0_4_ = 0;
    psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,psVar8,piVar9);
    return;
  }
  sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar4 == 6) {
    local_a8.view_._0_4_ = 0;
    psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,psVar8,piVar9);
    return;
  }
  sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar4 == 7) {
    local_a8.view_._0_4_ = 0;
    psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,psVar8,piVar9);
    return;
  }
  sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar4 == 8) {
    local_a8.view_._0_4_ = 0;
    psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,psVar8,piVar9);
    return;
  }
  sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar4 == 9) {
    local_a8.view_._0_4_ = 0;
    psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,psVar8,piVar9);
    return;
  }
  sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar4 == 10) {
    local_a8.view_._0_4_ = 0;
    psVar8 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    local_a8.view_._0_4_ = 0;
    piVar9 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (w,(int *)&local_a8);
    OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operate(v,w,psVar8,piVar9);
    return;
  }
  View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  Iterator<short,_false,_std::allocator<unsigned_long>_>::Iterator(&local_a8,v,0);
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(w);
  Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&local_60,w,0);
  while (bVar3 = Iterator<short,_false,_std::allocator<unsigned_long>_>::hasMore(&local_a8), bVar3)
  {
    bVar3 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore(&local_60);
    Assert<bool>(bVar3);
    psVar12 = Iterator<short,_false,_std::allocator<unsigned_long>_>::operator*(&local_a8);
    piVar13 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&local_60);
    *psVar12 = (short)((int)*psVar12 / *piVar13);
    Iterator<short,_false,_std::allocator<unsigned_long>_>::operator++(&local_a8);
    Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_60);
  }
  bVar3 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore(&local_60);
  Assert<bool>(!bVar3);
  if (local_60.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0022512f:
  if (local_a8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    return;
  }
  uVar14 = (long)local_a8.coordinates_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage -
           (long)local_a8.coordinates_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_a8.index_ =
       (size_t)local_a8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_002249ef:
  operator_delete((void *)local_a8.index_,uVar14);
  return;
}

Assistant:

inline void 
operate
(
    View<T1, false, A>& v, 
    const View<T2, isConst, A>& w, 
    Functor f
)
{
    if(!MARRAY_NO_ARG_TEST) {
        Assert(v.size() != 0 && w.size() != 0);
        Assert(w.dimension() == 0 || v.dimension() == w.dimension());
        if(w.dimension() != 0) {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == w.shape(j));
            }
        }
    }
    if(w.dimension() == 0) {
        T2 x = w(0);
        if(v.isSimple()) {
            T1* dataV = &v(0);
            for(std::size_t j=0; j<v.size(); ++j) {
                f(dataV[j], x);
            }
        }
        else if(v.dimension() == 1)
            OperateHelperBinaryScalar<1, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 2)
            OperateHelperBinaryScalar<2, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 3)
            OperateHelperBinaryScalar<3, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 4)
            OperateHelperBinaryScalar<4, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 5)
            OperateHelperBinaryScalar<5, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 6)
            OperateHelperBinaryScalar<6, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 7)
            OperateHelperBinaryScalar<7, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 8)
            OperateHelperBinaryScalar<8, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 9)
            OperateHelperBinaryScalar<9, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 10)
            OperateHelperBinaryScalar<10, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else {
            for(typename View<T1, false>::iterator it = v.begin(); it.hasMore(); ++it) {
                f(*it, x);
            }
        }
    }
    else {
        if(v.overlaps(w)) {
            Marray<T2> m = w; // temporary copy
            operate(v, m, f); // recursive call
        }
        else {
            if(v.coordinateOrder() == w.coordinateOrder() 
                && v.isSimple() && w.isSimple()) {
                T1* dataV = &v(0);
                const T2* dataW = &w(0);
                for(std::size_t j=0; j<v.size(); ++j) {
                    f(dataV[j], dataW[j]);
                }
            }
            else if(v.dimension() == 1)
                OperateHelperBinary<1, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 2)
                OperateHelperBinary<2, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 3)
                OperateHelperBinary<3, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 4)
                OperateHelperBinary<4, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 5)
                OperateHelperBinary<5, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 6)
                OperateHelperBinary<6, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 7)
                OperateHelperBinary<7, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 8)
                OperateHelperBinary<8, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 9)
                OperateHelperBinary<9, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 10)
                OperateHelperBinary<10, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else {
                typename View<T1, false>::iterator itV = v.begin();
                typename View<T2, isConst>::const_iterator itW = w.begin();
                for(; itV.hasMore(); ++itV, ++itW) {
                    Assert(MARRAY_NO_DEBUG || itW.hasMore());
                    f(*itV, *itW);
                }
                Assert(MARRAY_NO_DEBUG || !itW.hasMore());
            }
        }
    }
}